

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_base_z2_operators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                *matrix)

{
  initializer_list<bool> __l;
  initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>
  __l_00;
  initializer_list<bool> __l_01;
  initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>
  __l_02;
  initializer_list<bool> __l_03;
  initializer_list<bool> __l_04;
  initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>
  __l_05;
  initializer_list<bool> __l_06;
  initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>
  __l_07;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  lazy_ostream *plVar5;
  undefined4 local_81c;
  size_t local_818;
  basic_cstring<const_char> local_810;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_800;
  basic_cstring<const_char> local_7d8;
  basic_cstring<const_char> local_7c8;
  basic_cstring<const_char> local_7b8;
  basic_cstring<const_char> local_7a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_798;
  vector<bool,_std::allocator<bool>_> local_778;
  assertion_result local_750;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  bool local_717 [7];
  iterator local_710;
  undefined8 local_708;
  Field_element local_6f9;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_6f8;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_6f0;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_6e8;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_6e0;
  iterator local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c4;
  size_t local_6c0;
  basic_cstring<const_char> local_6b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6a8;
  basic_cstring<const_char> local_680;
  basic_cstring<const_char> local_670;
  basic_cstring<const_char> local_660;
  basic_cstring<const_char> local_650;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_640;
  vector<bool,_std::allocator<bool>_> local_620;
  assertion_result local_5f8;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  bool local_5bf [7];
  iterator local_5b8;
  undefined8 local_5b0;
  Field_element local_5a1;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_5a0;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_598;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_590;
  iterator local_588;
  undefined8 local_580;
  undefined4 local_574;
  size_t local_570;
  basic_cstring<const_char> local_568;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_558;
  basic_cstring<const_char> local_530;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4f0;
  vector<bool,_std::allocator<bool>_> local_4d0;
  assertion_result local_4a8;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  bool local_46f [7];
  iterator local_468;
  undefined8 local_460;
  Field_element local_451;
  initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>
  local_450;
  undefined4 local_43c;
  size_t local_438;
  basic_cstring<const_char> local_430;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_420;
  basic_cstring<const_char> local_3f8;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3b8;
  vector<bool,_std::allocator<bool>_> local_398;
  assertion_result local_370;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  bool local_337 [7];
  iterator local_330;
  undefined8 local_328;
  Field_element local_31d;
  undefined4 local_31c;
  size_t local_318;
  basic_cstring<const_char> local_310;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_300;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_298;
  vector<bool,_std::allocator<bool>_> local_278;
  assertion_result local_250;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  initializer_list<bool> local_218;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_208;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_200;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_1f8;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_1f0;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_1e8;
  iterator local_1e0;
  undefined8 local_1d8;
  undefined4 local_1cc;
  size_t local_1c8;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1b0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_148;
  vector<bool,_std::allocator<bool>_> local_128;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  bool local_c7 [7];
  iterator local_c0;
  undefined8 local_b8;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_a0;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_98;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_90;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_88;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  local_80;
  iterator local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> veccont;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  setcont;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
  *matrix_local;
  
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::set((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
         *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_68);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_a0,0);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_98,1);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_90,2);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_88,5);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_80,6);
  local_78 = &local_a0;
  local_70 = 5;
  __l_07._M_len = 5;
  __l_07._M_array = local_78;
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::operator=((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,__l_07);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::operator+=((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
                *)pvVar3,
               (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
                *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage);
  local_c7[0] = false;
  local_c7[1] = false;
  local_c7[2] = true;
  local_c7[3] = true;
  local_c7[4] = false;
  local_c7[5] = false;
  local_c7[6] = true;
  local_c0 = local_c7;
  local_b8 = 7;
  __l_06._M_len = 7;
  __l_06._M_array = local_c0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_06);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x327,&local_e8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,0);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_68);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::get_content(&local_128,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_128,(vector<bool,_std::allocator<bool>_> *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_100,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,"matrix[0].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_148,plVar5,&local_158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_148,&local_168,0x327,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_148);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x329,&local_188);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1b0,plVar5,(char (*) [1])0x28814a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,0);
    local_1c8 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_1cc = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1b0,&local_1c0,0x329,1,2,&local_1c8,"matrix[0].size()",&local_1cc,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_208,0);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_200,1);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_1f8,2);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_1f0,5);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_1e8,6);
  local_1e0 = &local_208;
  local_1d8 = 5;
  __l_05._M_len = 5;
  __l_05._M_array = local_1e0;
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::operator=((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,__l_05);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::operator+=((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
                *)pvVar3,
               (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
                *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage);
  std::initializer_list<bool>::initializer_list(&local_218);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,local_218);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x330,&local_238);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,1);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_68);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::get_content(&local_278,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_278,(vector<bool,_std::allocator<bool>_> *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_250,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,"matrix[1].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_298,plVar5,&local_2a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_250,&local_298,&local_2b8,0x330,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_298);
    boost::test_tools::assertion_result::~assertion_result(&local_250);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c8,0x332,&local_2d8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_300,plVar5,(char (*) [1])0x28814a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,1);
    local_318 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_31c = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_300,&local_310,0x332,1,2,&local_318,"matrix[1].size()",&local_31c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_300);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,4);
  local_31d = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)pvVar3,&local_31d,
             (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
              *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage);
  local_337[0] = false;
  local_337[1] = false;
  local_337[2] = true;
  local_337[3] = true;
  local_337[4] = false;
  local_337[5] = false;
  local_337[6] = true;
  local_330 = local_337;
  local_328 = 7;
  __l_04._M_len = 7;
  __l_04._M_array = local_330;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_04);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_358);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_348,0x338,&local_358);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,4);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_68);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::get_content(&local_398,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_398,(vector<bool,_std::allocator<bool>_> *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_370,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,"matrix[4].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_3b8,plVar5,&local_3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_370,&local_3b8,&local_3d8,0x338,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3b8);
    boost::test_tools::assertion_result::~assertion_result(&local_370);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_398);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3e8,0x33a,&local_3f8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_420,plVar5,(char (*) [1])0x28814a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,4);
    local_438 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_43c = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_420,&local_430,0x33a,1,2,&local_438,"matrix[4].size()",&local_43c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_420);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>
  ::initializer_list(&local_450);
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::operator=((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,local_450);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,5);
  local_451 = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  multiply_source_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)pvVar3,
             (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
              *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage,&local_451);
  local_46f[0] = true;
  local_46f[1] = true;
  local_46f[2] = true;
  local_46f[3] = false;
  local_46f[4] = false;
  local_46f[5] = true;
  local_46f[6] = true;
  local_468 = local_46f;
  local_460 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_468;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_03);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_490);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x340,&local_490);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_68);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::get_content(&local_4d0,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_4d0,(vector<bool,_std::allocator<bool>_> *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_4a8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_4f0,plVar5,&local_500);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4a8,&local_4f0,&local_510,0x340,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4f0);
    boost::test_tools::assertion_result::~assertion_result(&local_4a8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_4d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_530);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_520,0x342,&local_530);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_558,plVar5,(char (*) [1])0x28814a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    local_570 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_574 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_558,&local_568,0x342,1,2,&local_570,"matrix[5].size()",&local_574,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_558);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_5a0,2);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_598,3);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_590,6);
  local_588 = &local_5a0;
  local_580 = 3;
  __l_02._M_len = 3;
  __l_02._M_array = local_588;
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::operator=((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,__l_02);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,5);
  local_5a1 = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  multiply_source_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)pvVar3,
             (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
              *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage,&local_5a1);
  local_5bf[0] = true;
  local_5bf[1] = true;
  local_5bf[2] = false;
  local_5bf[3] = true;
  local_5bf[4] = false;
  local_5bf[5] = true;
  local_5bf[6] = false;
  local_5b8 = local_5bf;
  local_5b0 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_5b8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_01);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5d0,0x348,&local_5e0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_68);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::get_content(&local_620,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_620,(vector<bool,_std::allocator<bool>_> *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_5f8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_650,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_640,plVar5,&local_650);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_660,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_5f8,&local_640,&local_660,0x348,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_640);
    boost::test_tools::assertion_result::~assertion_result(&local_5f8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_620);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_670,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_680);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_670,0x34a,&local_680);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6a8,plVar5,(char (*) [1])0x28814a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    local_6c0 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_6c4 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_6a8,&local_6b8,0x34a,1,2,&local_6c0,"matrix[5].size()",&local_6c4,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_6f8,0);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_6f0,1);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_6e8,3);
  Gudhi::persistence_matrix::
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  ::Entry(&local_6e0,5);
  local_6d8 = &local_6f8;
  local_6d0 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_6d8;
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::operator=((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,__l_00);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,3);
  local_6f9 = false;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)pvVar3,&local_6f9,
             (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
              *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage);
  local_717[0] = true;
  local_717[1] = true;
  local_717[2] = false;
  local_717[3] = true;
  local_717[4] = false;
  local_717[5] = true;
  local_717[6] = false;
  local_710 = local_717;
  local_708 = 7;
  __l._M_len = 7;
  __l._M_array = local_710;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_728,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_738);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_728,0x350,&local_738);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,3);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_68);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::get_content(&local_778,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_778,(vector<bool,_std::allocator<bool>_> *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_750,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7a8,"matrix[3].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_798,plVar5,&local_7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_750,&local_798,&local_7b8,0x350,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_798);
    boost::test_tools::assertion_result::~assertion_result(&local_750);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_778);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7c8,0x352,&local_7d8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_800,plVar5,(char (*) [1])0x28814a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_810,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,3);
    local_818 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_81c = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_800,&local_810,0x352,1,2,&local_818,"matrix[3].size()",&local_81c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_800);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  ::~set((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
          *)&veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage);
  return;
}

Assistant:

void column_test_base_z2_operators(std::vector<Column>& matrix) {
  std::set<typename Column::Entry> setcont;
  std::vector<bool> veccont;

  setcont = {0, 1, 2, 5, 6};
  matrix[0] += setcont;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  setcont = {0, 1, 2, 5, 6};
  matrix[1] += setcont;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(1, setcont);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  setcont = {};
  matrix[5].multiply_source_and_add(setcont, 1);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  setcont = {2, 3, 6};
  matrix[5].multiply_source_and_add(setcont, 1);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  setcont = {0, 1, 3, 5};
  matrix[3].multiply_target_and_add(0, setcont);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}